

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_bary3(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *bary)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  undefined1 auVar7 [16];
  REF_DBL RVar8;
  REF_DBL RVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  REF_DBL RVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  REF_DBL normal [3];
  
  iVar1 = *nodes;
  if (((-1 < (long)iVar1) && (iVar2 = ref_node->max, iVar1 < iVar2)) &&
     (pRVar5 = ref_node->global, -1 < pRVar5[iVar1])) {
    uVar3 = nodes[1];
    if (((int)uVar3 < iVar2 && -1 < (int)uVar3) && (-1 < pRVar5[uVar3])) {
      uVar4 = nodes[2];
      if (((int)uVar4 < iVar2 && -1 < (int)uVar4) && (-1 < pRVar5[uVar4])) {
        pRVar6 = ref_node->real;
        ref_node_xyz_normal(xyz,pRVar6 + uVar3 * 0xf,pRVar6 + uVar4 * 0xf,normal);
        RVar8 = normal[2];
        *bary = normal[2];
        ref_node_xyz_normal(pRVar6 + (uint)(iVar1 * 0xf),xyz,pRVar6 + uVar4 * 0xf,normal);
        RVar9 = normal[2];
        bary[1] = normal[2];
        ref_node_xyz_normal(pRVar6 + (uint)(iVar1 * 0xf),pRVar6 + uVar3 * 0xf,xyz,normal);
        bary[2] = normal[2];
        dVar11 = RVar8 + RVar9 + normal[2];
        auVar15._0_8_ = dVar11 * 1e+20;
        auVar15._8_8_ = RVar8;
        auVar16._8_8_ = -RVar8;
        auVar16._0_8_ = -auVar15._0_8_;
        auVar16 = maxpd(auVar15,auVar16);
        dVar14 = auVar16._0_8_;
        if (auVar16._8_8_ < dVar14) {
          RVar13 = RVar9;
          if (RVar9 <= -RVar9) {
            RVar13 = -RVar9;
          }
          if (RVar13 < dVar14) {
            RVar13 = normal[2];
            if (normal[2] <= -normal[2]) {
              RVar13 = -normal[2];
            }
            if (RVar13 < dVar14) {
              auVar12._8_8_ = RVar9;
              auVar12._0_8_ = RVar8;
              auVar7._8_8_ = dVar11;
              auVar7._0_8_ = dVar11;
              auVar16 = divpd(auVar12,auVar7);
              *(undefined1 (*) [16])bary = auVar16;
              bary[2] = normal[2] / dVar11;
              return 0;
            }
          }
        }
        printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xae7,"ref_node_bary3");
        for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
          bary[lVar10] = 0.0;
        }
        return 4;
      }
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xacf,
         "ref_node_bary3",3,"node invalid");
  return 3;
}

Assistant:

REF_FCN REF_STATUS ref_node_bary3(REF_NODE ref_node, REF_INT *nodes,
                                  REF_DBL *xyz, REF_DBL *bary) {
  REF_DBL *xyz0, *xyz1, *xyz2;
  REF_DBL total, normal[3];

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]))
    RSS(REF_INVALID, "node invalid");

  xyz0 = ref_node_xyz_ptr(ref_node, nodes[0]);
  xyz1 = ref_node_xyz_ptr(ref_node, nodes[1]);
  xyz2 = ref_node_xyz_ptr(ref_node, nodes[2]);

  RSS(ref_node_xyz_normal(xyz, xyz1, xyz2, normal), "n0");
  bary[0] = normal[2];
  RSS(ref_node_xyz_normal(xyz0, xyz, xyz2, normal), "n1");
  bary[1] = normal[2];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz, normal), "n2");
  bary[2] = normal[2];

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
  } else {
    REF_INT i;
    printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2]);
    for (i = 0; i < 3; i++) bary[i] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}